

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

void __thiscall l2r_lr_fun::Hv(l2r_lr_fun *this,double *s,double *Hs)

{
  int iVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  EVP_PKEY_CTX *ctx;
  feature_node *local_40;
  feature_node *xi;
  double *wa;
  int w_size;
  int l;
  int i;
  double *Hs_local;
  double *s_local;
  l2r_lr_fun *this_local;
  
  iVar1 = this->prob->l;
  ctx = (EVP_PKEY_CTX *)s;
  iVar3 = (*(this->super_function)._vptr_function[3])();
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar1;
  uVar4 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  Reduce_Vectors::init(this->reduce_vectors,ctx);
  for (w_size = 0; w_size < iVar1; w_size = w_size + 1) {
    local_40 = this->prob->x[w_size];
    *(undefined8 *)((long)pvVar5 + (long)w_size * 8) = 0;
    for (; local_40->index != -1; local_40 = local_40 + 1) {
      *(double *)((long)pvVar5 + (long)w_size * 8) =
           s[local_40->index + -1] * local_40->value + *(double *)((long)pvVar5 + (long)w_size * 8);
    }
    *(double *)((long)pvVar5 + (long)w_size * 8) =
         this->C[w_size] * this->D[w_size] * *(double *)((long)pvVar5 + (long)w_size * 8);
    Reduce_Vectors::sum_scale_x
              (this->reduce_vectors,*(double *)((long)pvVar5 + (long)w_size * 8),
               this->prob->x[w_size]);
  }
  Reduce_Vectors::reduce_sum(this->reduce_vectors,Hs);
  for (w_size = 0; w_size < iVar3; w_size = w_size + 1) {
    Hs[w_size] = s[w_size] + Hs[w_size];
  }
  if (pvVar5 != (void *)0x0) {
    operator_delete__(pvVar5);
  }
  return;
}

Assistant:

void l2r_lr_fun::Hv(double *s, double *Hs)
{
	int i;
	int l=prob->l;
	int w_size=get_nr_variable();
	double *wa = new double[l];

	reduce_vectors->init();

#ifdef ENABLED_OPENMP
#pragma omp parallel for private(i) schedule(guided)
#endif
	for(i=0;i<l;i++)
	{
		feature_node *xi=prob->x[i];
		wa[i] = 0;
		while(xi->index != -1)
		{
			wa[i] += s[xi->index-1]*xi->value;
			xi++;
		}
		wa[i] = C[i]*D[i]*wa[i];
	
		reduce_vectors->sum_scale_x(wa[i], prob->x[i]);
	}

	reduce_vectors->reduce_sum(Hs);
	for(i=0;i<w_size;i++)
		Hs[i] = s[i] + Hs[i];
	delete[] wa;
}